

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

void __thiscall CoreML::Specification::Model::clear_normalizer(Model *this)

{
  ulong uVar1;
  Normalizer *this_00;
  undefined8 *puVar2;
  
  if (this->_oneof_case_[0] == 0x25f) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 == (undefined8 *)0x0) {
      this_00 = (this->Type_).normalizer_;
      if (this_00 != (Normalizer *)0x0) {
        Normalizer::~Normalizer(this_00);
      }
      operator_delete(this_00,0x18);
    }
    this->_oneof_case_[0] = 0;
  }
  return;
}

Assistant:

inline bool Model::_internal_has_normalizer() const {
  return Type_case() == kNormalizer;
}